

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

uint32_t NearLossless(uint32_t value,uint32_t predict,int max_quantization,int max_diff,
                     int used_subtract_green)

{
  byte bVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  int in_ECX;
  int in_EDX;
  uint8_t uVar5;
  uint32_t in_ESI;
  uint32_t in_EDI;
  int in_R8D;
  uint8_t b;
  uint8_t g;
  uint8_t r;
  uint8_t a;
  uint8_t green_diff;
  uint8_t new_green;
  int quantization;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined4 local_1c;
  undefined4 local_4;
  
  local_1d = '\0';
  local_1e = '\0';
  local_1c = in_EDX;
  if (in_ECX < 3) {
    local_4 = VP8LSubPixels(in_EDI,in_ESI);
  }
  else {
    for (; in_ECX <= local_1c; local_1c = local_1c >> 1) {
    }
    uVar2 = (uint8_t)(in_EDI >> 0x18);
    uVar5 = (uint8_t)(in_ESI >> 0x18);
    if ((in_EDI >> 0x18 == 0) || (in_EDI >> 0x18 == 0xff)) {
      local_1f = NearLosslessDiff(uVar2,uVar5);
    }
    else {
      local_1f = NearLosslessComponent(uVar2,uVar5,0xff,local_1c);
    }
    uVar2 = (uint8_t)(in_EDI >> 8);
    uVar5 = (uint8_t)(in_ESI >> 8);
    bVar1 = NearLosslessComponent(uVar2,uVar5,0xff,local_1c);
    if (in_R8D != 0) {
      local_1d = uVar5 + bVar1;
      local_1e = NearLosslessDiff(local_1d,uVar2);
    }
    uVar2 = NearLosslessDiff((uint8_t)(in_EDI >> 0x10),local_1e);
    bVar3 = NearLosslessComponent(uVar2,(uint8_t)(in_ESI >> 0x10),0xff - local_1d,local_1c);
    uVar2 = NearLosslessDiff((uint8_t)in_EDI,local_1e);
    bVar4 = NearLosslessComponent(uVar2,(uint8_t)in_ESI,0xff - local_1d,local_1c);
    local_4 = (uint)local_1f << 0x18 | (uint)bVar3 << 0x10 | (uint)bVar1 << 8 | (uint)bVar4;
  }
  return local_4;
}

Assistant:

static uint32_t NearLossless(uint32_t value, uint32_t predict,
                             int max_quantization, int max_diff,
                             int used_subtract_green) {
  int quantization;
  uint8_t new_green = 0;
  uint8_t green_diff = 0;
  uint8_t a, r, g, b;
  if (max_diff <= 2) {
    return VP8LSubPixels(value, predict);
  }
  quantization = max_quantization;
  while (quantization >= max_diff) {
    quantization >>= 1;
  }
  if ((value >> 24) == 0 || (value >> 24) == 0xff) {
    // Preserve transparency of fully transparent or fully opaque pixels.
    a = NearLosslessDiff((value >> 24) & 0xff, (predict >> 24) & 0xff);
  } else {
    a = NearLosslessComponent(value >> 24, predict >> 24, 0xff, quantization);
  }
  g = NearLosslessComponent((value >> 8) & 0xff, (predict >> 8) & 0xff, 0xff,
                            quantization);
  if (used_subtract_green) {
    // The green offset will be added to red and blue components during decoding
    // to obtain the actual red and blue values.
    new_green = ((predict >> 8) + g) & 0xff;
    // The amount by which green has been adjusted during quantization. It is
    // subtracted from red and blue for compensation, to avoid accumulating two
    // quantization errors in them.
    green_diff = NearLosslessDiff(new_green, (value >> 8) & 0xff);
  }
  r = NearLosslessComponent(NearLosslessDiff((value >> 16) & 0xff, green_diff),
                            (predict >> 16) & 0xff, 0xff - new_green,
                            quantization);
  b = NearLosslessComponent(NearLosslessDiff(value & 0xff, green_diff),
                            predict & 0xff, 0xff - new_green, quantization);
  return ((uint32_t)a << 24) | ((uint32_t)r << 16) | ((uint32_t)g << 8) | b;
}